

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,ByteData *binary_data)

{
  bool bVar1;
  size_t sVar2;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_005c1a90;
  this->type_ = kElementBinary;
  ScriptOperator::ScriptOperator(&this->op_code_,kOpInvalidOpCode);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->binary_data_).data_,&binary_data->data_);
  this->value_ = 0;
  sVar2 = ByteData::GetDataSize(binary_data);
  if ((int)sVar2 - 1U < 5) {
    bVar1 = ConvertBinaryToNumber(this,&this->value_);
    if (bVar1) {
      this->type_ = kElementNumber;
    }
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(const ByteData& binary_data)
    : type_(kElementBinary),
      op_code_(kOpInvalidOpCode),
      binary_data_(binary_data),
      value_(0) {
  // check number
  uint32_t size = static_cast<uint32_t>(binary_data.GetDataSize());
  if ((size > 0) && (size <= 5) && ConvertBinaryToNumber(&value_)) {
    type_ = kElementNumber;
  }
}